

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O3

int ffdstr(fitsfile *fptr,char *string,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  undefined1 auVar3 [16];
  int iVar4;
  size_t sVar5;
  char value [71];
  char valstring [71];
  char comm [73];
  char card [81];
  char nextcomm [73];
  char local_1e8 [80];
  char local_198 [80];
  char local_148 [96];
  char local_e8 [96];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  iVar4 = ffgstr(fptr,string,local_e8,status);
  if (iVar4 < 1) {
    pFVar2 = fptr->Fptr;
    auVar3 = SEXT816(pFVar2->nextkey - pFVar2->headstart[pFVar2->curhdu]) *
             SEXT816(0x6666666666666667);
    iVar4 = (int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f);
    ffdrec(fptr,iVar4,status);
    ffpsvc(local_e8,local_198,local_148,status);
    if (0 < *status) {
      return *status;
    }
    ffpmrk();
    ffc2s(local_198,local_1e8,status);
    iVar1 = *status;
    if (iVar1 == 0xcc) {
      ffcmrk();
      *status = 0;
      return 0;
    }
    sVar5 = strlen(local_1e8);
    if ((int)sVar5 == 0) {
      return iVar1;
    }
    do {
      if ((local_1e8[(int)sVar5 + -1] != '&') ||
         (ffgcnt(fptr,local_1e8,local_88,status), local_1e8[0] == '\0')) break;
      ffdrec(fptr,iVar4,status);
      sVar5 = strlen(local_1e8);
    } while ((int)sVar5 != 0);
  }
  else {
    snprintf(local_148,0x51,"Could not find the %s keyword to delete (ffdkey)",string);
    ffpmsg(local_148);
  }
  return *status;
}

Assistant:

int ffdstr(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *string,     /* I - keyword name       */
           int *status)       /* IO - error status      */
/*
  delete a specified header keyword containing the input string
*/
{
    int keypos, len;
    char valstring[FLEN_VALUE], comm[FLEN_COMMENT], value[FLEN_VALUE];
    char card[FLEN_CARD], message[FLEN_ERRMSG], nextcomm[FLEN_COMMENT];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgstr(fptr, string, card, status) > 0) /* read keyword */
    {
        snprintf(message, FLEN_ERRMSG,"Could not find the %s keyword to delete (ffdkey)",
                string);
        ffpmsg(message);
        return(*status);
    }

    /* calc position of keyword in header */
    keypos = (int) ((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80);

    ffdrec(fptr, keypos, status);  /* delete the keyword */

    /* check for string value which may be continued over multiple keywords */
    ffpsvc(card, valstring, comm, status);

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check for string value which may be continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(valstring, value, status);   /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
 
      len = strlen(value);

      while (len && value[len - 1] == '&')  /* ampersand used as continuation char */
      {
        ffgcnt(fptr, value, nextcomm, status);
        if (*value)
        {
            ffdrec(fptr, keypos, status);  /* delete the keyword */
            len = strlen(value);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}